

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

MauResult __thiscall
mau::ProxySession::Inject(ProxySession *this,uint16_t sourcePort,void *datagram,uint bytes)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint8_t *puVar4;
  uint in_ECX;
  void *in_RDX;
  unsigned_short in_SI;
  LogStringBuffer *in_RDI;
  UDPAddress clientAddress;
  UDPAddress serverAddress;
  QueueNode *queueNode;
  uint8_t *readBuffer;
  Locker locker;
  Locker locker_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  address *in_stack_fffffffffffff638;
  LogStringBuffer *in_stack_fffffffffffff640;
  address *in_stack_fffffffffffff648;
  basic_endpoint<asio::ip::udp> *in_stack_fffffffffffff658;
  LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *in_stack_fffffffffffff660;
  LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *in_stack_fffffffffffff668;
  LogStringBuffer *in_stack_fffffffffffff678;
  LogStringBuffer *buffer_00;
  undefined6 in_stack_fffffffffffff680;
  undefined2 in_stack_fffffffffffff686;
  unsigned_short local_8d2 [17];
  string local_8b0 [38];
  unsigned_short local_88a;
  QueueNode *in_stack_fffffffffffff778;
  DeliveryChannel *in_stack_fffffffffffff780;
  string local_868 [160];
  uint8_t *local_7c8;
  uint8_t *local_7b0;
  undefined4 local_7a4;
  uint local_794;
  void *local_790;
  unsigned_short local_782;
  MauResult local_778;
  int local_75c;
  undefined1 *local_758;
  ushort *local_750;
  char *local_748;
  string *local_740;
  char *local_738;
  ushort *local_728;
  char *local_720;
  string *local_718;
  char *local_710;
  ushort *local_700;
  char *local_6f8;
  string *local_6f0;
  char *local_6e8;
  undefined4 local_6dc;
  undefined4 local_6cc;
  undefined1 local_6b0 [16];
  ostream oStack_6a0;
  ushort *local_528;
  char *local_520;
  string *local_518;
  char *local_510;
  undefined4 local_504;
  ushort *local_4f8;
  char *local_4f0;
  string *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  ushort *local_498;
  char *local_490;
  string *local_488;
  char *local_480;
  undefined1 *local_478;
  ushort *local_468;
  char *local_460;
  string *local_458;
  undefined1 *local_450;
  string *local_440;
  undefined1 *local_438;
  string *local_428;
  undefined1 *local_420;
  ushort *local_418;
  char *local_410;
  undefined1 *local_408;
  char *local_3f8;
  undefined1 *local_3f0;
  ushort *local_3e0;
  undefined1 *local_3d8;
  char *local_3c8;
  undefined1 *local_3c0;
  ushort *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  char *local_390;
  undefined1 *local_388;
  ushort *local_380;
  char *local_378;
  string *local_370;
  char *local_368;
  undefined4 local_35c;
  undefined4 local_34c;
  undefined1 local_330 [16];
  ostream oStack_320;
  ushort *local_1a8;
  char *local_1a0;
  string *local_198;
  char *local_190;
  undefined4 local_184;
  ushort *local_178;
  char *local_170;
  string *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_128;
  undefined1 *local_120;
  ushort *local_118;
  char *local_110;
  string *local_108;
  char *local_100;
  undefined1 *local_f8;
  ushort *local_e8;
  char *local_e0;
  string *local_d8;
  undefined1 *local_d0;
  string *local_c0;
  undefined1 *local_b8;
  string *local_a8;
  undefined1 *local_a0;
  ushort *local_98;
  char *local_90;
  undefined1 *local_88;
  char *local_78;
  undefined1 *local_70;
  ushort *local_60;
  undefined1 *local_58;
  char *local_48;
  undefined1 *local_40;
  ushort *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_10;
  undefined1 *local_8;
  
  local_794 = in_ECX;
  local_790 = in_RDX;
  local_782 = in_SI;
  Locker::Locker((Locker *)in_stack_fffffffffffff640,(Lock *)in_stack_fffffffffffff638);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff648);
  if (bVar1) {
    local_778 = Mau_Success;
  }
  else if (*(uint *)&in_RDI[1].LogStream.field_0x148 < local_794) {
    local_778 = Mau_InvalidInput;
  }
  else {
    local_758 = &(in_RDI->LogStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x60;
    local_75c = local_794 + 0x1c;
    Locker::Locker((Locker *)in_stack_fffffffffffff640,(Lock *)in_stack_fffffffffffff638);
    puVar4 = pktalloc::Allocator::Allocate
                       ((Allocator *)CONCAT26(in_stack_fffffffffffff686,in_stack_fffffffffffff680),
                        (uint)((ulong)in_stack_fffffffffffff678 >> 0x20));
    Locker::~Locker((Locker *)0x121deb);
    *(uint *)(puVar4 + 0x18) = local_794;
    local_7c8 = puVar4;
    local_7b0 = puVar4;
    memcpy(puVar4 + 0x1c,local_790,(ulong)local_794);
    LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get(in_stack_fffffffffffff668);
    uVar3 = local_782;
    uVar2 = asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x121e79)
    ;
    if (uVar3 == uVar2) {
      DeliveryChannel::InsertQueueNode(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    }
    else {
      LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get(in_stack_fffffffffffff668);
      uVar3 = asio::ip::basic_endpoint<asio::ip::udp>::port
                        ((basic_endpoint<asio::ip::udp> *)0x121f20);
      if (uVar3 == 0) {
        asio::ip::address_v4::loopback();
        asio::ip::address::address
                  ((address *)in_stack_fffffffffffff640,(address_v4 *)in_stack_fffffffffffff638);
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff640,
                   in_stack_fffffffffffff638,0);
        asio::ip::basic_endpoint<asio::ip::udp>::operator=
                  ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff640,
                   (basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff638);
        LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                  (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
        DeliveryChannel::SetDeliveryAddress
                  ((DeliveryChannel *)in_stack_fffffffffffff640,
                   (UDPAddress *)in_stack_fffffffffffff638);
        DeliveryChannel::InsertQueueNode(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
        asio::ip::basic_endpoint<asio::ip::udp>::address
                  ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff638);
        asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffff648);
        local_88a = asio::ip::basic_endpoint<asio::ip::udp>::port
                              ((basic_endpoint<asio::ip::udp> *)0x12203f);
        local_738 = "Inject: Set client address to ";
        local_740 = local_868;
        local_748 = " : ";
        local_750 = &local_88a;
        local_6dc = 1;
        local_6e8 = "Inject: Set client address to ";
        local_6f8 = " : ";
        local_6cc = 1;
        local_700 = local_750;
        local_6f0 = local_740;
        if ((int)in_RDI->LogLevel < 2) {
          local_504 = 1;
          local_510 = "Inject: Set client address to ";
          local_520 = " : ";
          local_528 = local_750;
          local_518 = local_740;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638,Trace);
          local_4d8 = &(in_RDI->LogStream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x28;
          local_4d0 = local_6b0;
          local_4e0 = local_510;
          local_4e8 = local_518;
          local_4f0 = local_520;
          local_4f8 = local_528;
          local_4c0 = local_4d8;
          local_4b8 = local_4d0;
          local_4a8 = local_4d8;
          local_4a0 = local_4d0;
          std::operator<<(&oStack_6a0,(string *)local_4d8);
          local_478 = local_4d0;
          local_480 = local_4e0;
          local_488 = local_4e8;
          local_490 = local_4f0;
          local_498 = local_4f8;
          local_3a0 = local_4d0;
          local_3a8 = local_4e0;
          local_388 = local_4d0;
          local_390 = local_4e0;
          std::operator<<((ostream *)(local_4d0 + 0x10),local_4e0);
          local_450 = local_478;
          local_458 = local_488;
          local_460 = local_490;
          local_468 = local_498;
          local_438 = local_478;
          local_440 = local_488;
          local_420 = local_478;
          local_428 = local_488;
          std::operator<<((ostream *)(local_478 + 0x10),local_488);
          local_408 = local_450;
          local_410 = local_460;
          local_418 = local_468;
          local_3f0 = local_450;
          local_3f8 = local_460;
          local_3c0 = local_450;
          local_3c8 = local_460;
          std::operator<<((ostream *)(local_450 + 0x10),local_460);
          local_3d8 = local_408;
          local_3e0 = local_418;
          local_3b0 = local_408;
          local_3b8 = local_418;
          std::ostream::operator<<(local_408 + 0x10,*local_418);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write
                    ((OutputWorker *)CONCAT26(in_stack_fffffffffffff686,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff678);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1225ca);
        }
        std::__cxx11::string::~string(local_868);
      }
      else {
        uVar3 = asio::ip::basic_endpoint<asio::ip::udp>::port
                          ((basic_endpoint<asio::ip::udp> *)0x122629);
        if (uVar3 == local_782) {
          DeliveryChannel::InsertQueueNode(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
        }
        else {
          asio::ip::basic_endpoint<asio::ip::udp>::address
                    ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff638);
          asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffff648);
          uVar3 = asio::ip::basic_endpoint<asio::ip::udp>::port
                            ((basic_endpoint<asio::ip::udp> *)0x1226af);
          local_710 = "Inject: Ignored data from unrecognized source address ";
          local_718 = local_8b0;
          local_720 = " : ";
          local_728 = local_8d2;
          local_35c = 3;
          local_368 = "Inject: Ignored data from unrecognized source address ";
          local_378 = " : ";
          local_34c = 3;
          local_8d2[0] = uVar3;
          local_380 = local_728;
          local_370 = local_718;
          if ((int)in_RDI->LogLevel < 4) {
            local_184 = 3;
            local_190 = "Inject: Ignored data from unrecognized source address ";
            local_1a0 = " : ";
            buffer_00 = in_RDI;
            local_1a8 = local_728;
            local_198 = local_718;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638,Trace);
            local_158 = &(in_RDI->LogStream).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x28;
            local_150 = local_330;
            local_160 = local_190;
            local_168 = local_198;
            local_170 = local_1a0;
            local_178 = local_1a8;
            local_140 = local_158;
            local_138 = local_150;
            local_128 = local_158;
            local_120 = local_150;
            std::operator<<(&oStack_320,(string *)local_158);
            local_f8 = local_150;
            local_100 = local_160;
            local_108 = local_168;
            local_110 = local_170;
            local_118 = local_178;
            local_20 = local_150;
            local_28 = local_160;
            local_8 = local_150;
            local_10 = local_160;
            std::operator<<((ostream *)(local_150 + 0x10),local_160);
            local_d0 = local_f8;
            local_d8 = local_108;
            local_e0 = local_110;
            local_e8 = local_118;
            local_b8 = local_f8;
            local_c0 = local_108;
            local_a0 = local_f8;
            local_a8 = local_108;
            std::operator<<((ostream *)(local_f8 + 0x10),local_108);
            local_88 = local_d0;
            local_90 = local_e0;
            local_98 = local_e8;
            local_70 = local_d0;
            local_78 = local_e0;
            local_40 = local_d0;
            local_48 = local_e0;
            std::operator<<((ostream *)(local_d0 + 0x10),local_e0);
            local_58 = local_88;
            local_60 = local_98;
            local_30 = local_88;
            local_38 = local_98;
            std::ostream::operator<<(local_88 + 0x10,*local_98);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write
                      ((OutputWorker *)CONCAT26(uVar3,in_stack_fffffffffffff680),buffer_00);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x122c12);
          }
          std::__cxx11::string::~string(local_8b0);
        }
      }
    }
    local_778 = Mau_Success;
  }
  local_7a4 = 1;
  Locker::~Locker((Locker *)0x122c83);
  return local_778;
}

Assistant:

MauResult ProxySession::Inject(
    uint16_t sourcePort, ///< [in] Source port
    const void* datagram, ///< [in] Datagram buffer
    unsigned bytes) ///< [in] Datagram bytes
{
    Locker locker(APILock);

    if (Terminated) {
        return Mau_Success;
    }

    if (bytes > ProxyConfig.MaxDatagramBytes) {
        MAU_DEBUG_BREAK();
        return Mau_InvalidInput;
    }
    uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + bytes);

    QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
    queueNode->Bytes = bytes;
    memcpy(&queueNode->Data[0], datagram, bytes);

    const UDPAddress serverAddress = ServerAddress.Get();
    if (sourcePort == serverAddress.port()) {
        S2C.InsertQueueNode(queueNode);
    }
    else
    {
        UDPAddress clientAddress = ClientAddress.Get();
        if (clientAddress.port() == 0)
        {
            clientAddress = UDPAddress(asio::ip::address_v4::loopback(), sourcePort);
            ClientAddress.Set(clientAddress);
            S2C.SetDeliveryAddress(clientAddress);

            C2S.InsertQueueNode(queueNode);

            Logger.Debug("Inject: Set client address to ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
        else if (clientAddress.port() == sourcePort) {
            C2S.InsertQueueNode(queueNode);
        }
        else {
            Logger.Warning("Inject: Ignored data from unrecognized source address ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
    }

    return Mau_Success;
}